

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexPacket.cpp
# Opt level: O1

VertexPacket * __thiscall rr::VertexPacketAllocator::alloc(VertexPacketAllocator *this)

{
  pointer ppVVar1;
  VertexPacket *pVVar2;
  vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> local_30;
  
  if ((this->m_singleAllocPool).
      super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->m_singleAllocPool).
      super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    allocArray(&local_30,this,8);
    std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::_M_move_assign
              (&this->m_singleAllocPool,&local_30);
    if (local_30.super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30.
                      super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_30.
                            super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_30.
                            super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  ppVVar1 = (this->m_singleAllocPool).
            super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pVVar2 = ppVVar1[-1];
  (this->m_singleAllocPool).
  super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppVVar1 + -1;
  return pVVar2;
}

Assistant:

VertexPacket* VertexPacketAllocator::alloc (void)
{
	const size_t poolSize = 8;

	if (m_singleAllocPool.empty())
		m_singleAllocPool = allocArray(poolSize);

	VertexPacket* packet = *--m_singleAllocPool.end();
	m_singleAllocPool.pop_back();
	return packet;
}